

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> * __thiscall
TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3>::operator=
          (TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *this,
          TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *copy)

{
  undefined8 *puVar1;
  TPZManVector<TFad<6,_double>,_3> *pTVar2;
  double dVar3;
  undefined1 auVar4 [16];
  ulong *puVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  if (this != copy) {
    uVar10 = (copy->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements;
    if (((this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc < (long)uVar10) &&
       (pTVar2 = (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore,
       pTVar2 != this->fExtAlloc && pTVar2 != (TPZManVector<TFad<6,_double>,_3> *)0x0)) {
      dVar3 = pTVar2[-1].fExtAlloc[2].dx_[5];
      if (dVar3 != 0.0) {
        lVar9 = (long)dVar3 * 0xe0;
        do {
          TPZManVector<TFad<6,_double>,_3>::~TPZManVector
                    ((TPZManVector<TFad<6,_double>,_3> *)
                     ((long)pTVar2[-1].fExtAlloc[0].dx_ + lVar9 + -0x30));
          lVar9 = lVar9 + -0xe0;
        } while (lVar9 != 0);
      }
      operator_delete__(pTVar2[-1].fExtAlloc[2].dx_ + 5,(long)dVar3 * 0xe0 | 8);
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore =
           (TPZManVector<TFad<6,_double>,_3> *)0x0;
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = 0;
    }
    if ((long)uVar10 < 4) {
      pTVar2 = (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore;
      if (pTVar2 != (TPZManVector<TFad<6,_double>,_3> *)0x0 && pTVar2 != this->fExtAlloc) {
        dVar3 = pTVar2[-1].fExtAlloc[2].dx_[5];
        if (dVar3 != 0.0) {
          lVar9 = (long)dVar3 * 0xe0;
          do {
            TPZManVector<TFad<6,_double>,_3>::~TPZManVector
                      ((TPZManVector<TFad<6,_double>,_3> *)
                       ((long)pTVar2[-1].fExtAlloc[0].dx_ + lVar9 + -0x30));
            lVar9 = lVar9 + -0xe0;
          } while (lVar9 != 0);
        }
        operator_delete__(pTVar2[-1].fExtAlloc[2].dx_ + 5,(long)dVar3 * 0xe0 | 8);
      }
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = 0;
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore = this->fExtAlloc;
    }
    else if ((this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc < (long)uVar10) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar10;
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0xe0),8) == 0) {
        uVar6 = SUB168(auVar4 * ZEXT816(0xe0),0) | 8;
      }
      puVar5 = (ulong *)operator_new__(uVar6);
      *puVar5 = uVar10;
      lVar9 = 8;
      puVar7 = puVar5;
      do {
        puVar1 = (undefined8 *)((long)puVar5 + lVar9 + 8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)puVar5 + lVar9 + 0x18) = 0;
        *(undefined ***)((long)puVar5 + lVar9) = &PTR__TPZManVector_0189f520;
        lVar8 = 0x30;
        do {
          *(undefined ***)((long)puVar7 + lVar8 + -8) = &PTR__TFad_0185d2b8;
          *(undefined8 *)((long)puVar7 + lVar8) = 0;
          ((undefined8 *)((long)puVar7 + lVar8))[1] = 0;
          puVar1 = (undefined8 *)((long)puVar7 + lVar8 + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)puVar7 + lVar8 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)puVar7 + lVar8 + 0x30) = 0;
          lVar8 = lVar8 + 0x40;
        } while (lVar8 != 0xf0);
        *(long *)((long)puVar5 + lVar9 + 8) = (long)puVar5 + lVar9 + 0x20;
        lVar8 = lVar9 + 0xe0;
        *(undefined8 *)((long)puVar5 + lVar9 + 0x10) = 0;
        *(undefined8 *)((long)puVar5 + lVar9 + 0x18) = 0;
        puVar7 = puVar7 + 0x1c;
        lVar9 = lVar9 + 0xe0;
      } while ((ulong *)((long)puVar5 + lVar8) != puVar5 + uVar10 * 0x1c + 1);
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore =
           (TPZManVector<TFad<6,_double>,_3> *)(puVar5 + 1);
      (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = uVar10;
    }
    (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = uVar10;
    if (0 < (long)uVar10) {
      lVar9 = 0;
      do {
        TPZManVector<TFad<6,_double>,_3>::operator=
                  ((TPZManVector<TFad<6,_double>,_3> *)
                   ((long)((this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore)->
                          fExtAlloc[0].dx_ + lVar9 + -0x30),
                   (TPZManVector<TFad<6,_double>,_3> *)
                   ((long)((copy->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore)->
                          fExtAlloc[0].dx_ + lVar9 + -0x30));
        lVar9 = lVar9 + 0xe0;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}